

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  seqStore_t *psVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  U32 UVar12;
  U32 UVar13;
  void *pvVar14;
  void *pvVar15;
  size_t sVar16;
  size_t sVar17;
  long in_RCX;
  uint *in_RDX;
  long in_RDI;
  void *in_R8;
  long in_R9;
  bool bVar18;
  U32 stepSize;
  U32 mls;
  U32 hlog;
  U32 tmpOff_3;
  size_t rLength_3;
  U32 offset_5;
  BYTE *match_3;
  U32 matchIndex_3;
  U32 current_3;
  size_t h_3;
  size_t mLength_3;
  U32 maxRep_3;
  U32 offsetSaved_3;
  U32 offset_2_3;
  U32 offset_1_3;
  BYTE *ilimit_3;
  BYTE *iend_3;
  BYTE *lowest_3;
  U32 lowestIndex_3;
  BYTE *anchor_3;
  BYTE *ip_3;
  BYTE *istart_3;
  BYTE *base_3;
  U32 *hashTable_3;
  U32 tmpOff_2;
  size_t rLength_2;
  U32 offset_4;
  BYTE *match_2;
  U32 matchIndex_2;
  U32 current_2;
  size_t h_2;
  size_t mLength_2;
  U32 maxRep_2;
  U32 offsetSaved_2;
  U32 offset_2_2;
  U32 offset_1_2;
  BYTE *ilimit_2;
  BYTE *iend_2;
  BYTE *lowest_2;
  U32 lowestIndex_2;
  BYTE *anchor_2;
  BYTE *ip_2;
  BYTE *istart_2;
  BYTE *base_2;
  U32 *hashTable_2;
  U32 tmpOff_1;
  size_t rLength_1;
  U32 offset_3;
  BYTE *match_1;
  U32 matchIndex_1;
  U32 current_1;
  size_t h_1;
  size_t mLength_1;
  U32 maxRep_1;
  U32 offsetSaved_1;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *lowest_1;
  U32 lowestIndex_1;
  BYTE *anchor_1;
  BYTE *ip_1;
  BYTE *istart_1;
  BYTE *base_1;
  U32 *hashTable_1;
  U32 tmpOff;
  size_t rLength;
  U32 offset;
  BYTE *match;
  U32 matchIndex;
  U32 current;
  size_t h;
  size_t mLength;
  U32 maxRep;
  U32 offsetSaved;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *lowest;
  U32 lowestIndex;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *base;
  U32 *hashTable;
  U32 in_stack_fffffffffffffb4c;
  U32 in_stack_fffffffffffffb50;
  U32 in_stack_fffffffffffffb54;
  undefined4 in_stack_fffffffffffffb58;
  uint uVar19;
  int in_stack_fffffffffffffb5c;
  seqStore_t *in_stack_fffffffffffffb60;
  seqStore_t *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  seqStore_t *in_stack_fffffffffffffb88;
  uint local_45c;
  uint local_458;
  uint local_40c;
  uint local_408;
  uint local_3bc;
  uint local_3b8;
  size_t local_328;
  void *local_308;
  long local_2f0;
  uint local_2e4;
  uint local_2e0;
  uint local_2dc;
  void *local_2b8;
  void *local_2b0;
  void *local_240;
  long local_228;
  uint local_21c;
  uint local_218;
  uint local_214;
  void *local_1f0;
  void *local_1e8;
  void *local_178;
  long local_160;
  uint local_154;
  uint local_150;
  uint local_14c;
  void *local_128;
  void *local_120;
  void *local_b0;
  long local_98;
  uint local_8c;
  uint local_88;
  uint local_84;
  void *local_60;
  void *local_58;
  
  uVar19 = *(uint *)(in_RCX + 0x14);
  switch(*(undefined4 *)(in_RCX + 0x10)) {
  default:
    lVar4 = *(long *)(in_RDI + 0x30);
    lVar5 = *(long *)(in_RDI + 8);
    uVar1 = *(uint *)(in_RDI + 0x18);
    pvVar14 = (void *)(lVar5 + (ulong)uVar1);
    pvVar15 = (void *)((long)in_R8 + in_R9 + -8);
    uVar2 = *in_RDX;
    uVar3 = in_RDX[1];
    local_8c = 0;
    local_58 = (void *)((long)in_R8 + (long)(int)(uint)(in_R8 == pvVar14));
    uVar10 = (int)local_58 - (int)pvVar14;
    local_88 = uVar3;
    if (uVar10 < uVar3) {
      local_88 = 0;
      local_8c = uVar3;
    }
    local_84 = uVar2;
    local_60 = in_R8;
    if (uVar10 < uVar2) {
      local_84 = 0;
      local_8c = uVar2;
    }
    while (local_58 < pvVar15) {
      sVar16 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                            in_stack_fffffffffffffb54,in_stack_fffffffffffffb50);
      iVar8 = (int)lVar5;
      iVar7 = (int)local_58;
      iVar11 = iVar7 - iVar8;
      uVar2 = *(uint *)(lVar4 + sVar16 * 4);
      local_b0 = (void *)(lVar5 + (ulong)uVar2);
      *(int *)(lVar4 + sVar16 * 4) = iVar11;
      UVar12 = MEM_read32((void *)((long)local_58 + (1 - (ulong)local_84)));
      UVar13 = MEM_read32((void *)((long)local_58 + 1));
      if (local_84 == 0 || UVar12 != UVar13) {
        if (uVar1 < uVar2) {
          UVar12 = MEM_read32(local_b0);
          UVar13 = MEM_read32(local_58);
          if (UVar12 == UVar13) {
            sVar16 = ZSTD_count((BYTE *)in_stack_fffffffffffffb88,
                                (BYTE *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80
                                                ),(BYTE *)in_stack_fffffffffffffb78);
            local_98 = sVar16 + 4;
            iVar9 = (int)local_b0;
            while( true ) {
              bVar18 = false;
              if (local_60 < local_58 && pvVar14 < local_b0) {
                bVar18 = *(char *)((long)local_58 + -1) == *(char *)((long)local_b0 + -1);
              }
              if (!bVar18) break;
              local_58 = (void *)((long)local_58 + -1);
              local_b0 = (void *)((long)local_b0 + -1);
              local_98 = local_98 + 1;
            }
            local_88 = local_84;
            ZSTD_storeSeq(in_stack_fffffffffffffb60,
                          CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                          (void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                          in_stack_fffffffffffffb4c,0x2a5dcd);
            local_84 = iVar7 - iVar9;
            goto LAB_002a5dcd;
          }
        }
        local_58 = (void *)(((long)local_58 - (long)local_60 >> 8) + (ulong)uVar19 + (long)local_58)
        ;
      }
      else {
        sVar16 = ZSTD_count((BYTE *)in_stack_fffffffffffffb88,
                            (BYTE *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            (BYTE *)in_stack_fffffffffffffb78);
        local_98 = sVar16 + 4;
        local_58 = (void *)((long)local_58 + 1);
        ZSTD_storeSeq(in_stack_fffffffffffffb60,
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                      (void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                      in_stack_fffffffffffffb4c,0x2a5bfd);
LAB_002a5dcd:
        local_60 = (void *)(local_98 + (long)local_58);
        local_58 = local_60;
        if (local_60 <= pvVar15) {
          sVar16 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58
                                                ),in_stack_fffffffffffffb54,
                                in_stack_fffffffffffffb50);
          *(int *)(lVar4 + sVar16 * 4) = iVar11 + 2;
          sVar16 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58
                                                ),in_stack_fffffffffffffb54,
                                in_stack_fffffffffffffb50);
          *(int *)(lVar4 + sVar16 * 4) = ((int)local_60 + -2) - iVar8;
          while( true ) {
            uVar2 = local_88;
            bVar18 = false;
            if (local_58 <= pvVar15) {
              UVar12 = MEM_read32(local_58);
              UVar13 = MEM_read32((void *)((long)local_58 - (ulong)local_88));
              bVar18 = local_88 != 0 && UVar12 == UVar13;
            }
            local_60 = local_58;
            if (!bVar18) break;
            sVar16 = ZSTD_count((BYTE *)in_stack_fffffffffffffb88,
                                (BYTE *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80
                                                ),(BYTE *)in_stack_fffffffffffffb78);
            local_88 = local_84;
            local_84 = uVar2;
            sVar17 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,
                                                   in_stack_fffffffffffffb58),
                                  in_stack_fffffffffffffb54,in_stack_fffffffffffffb50);
            *(int *)(lVar4 + sVar17 * 4) = (int)local_58 - iVar8;
            ZSTD_storeSeq(in_stack_fffffffffffffb60,
                          CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                          (void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                          in_stack_fffffffffffffb4c,0x2a6057);
            local_58 = (void *)(sVar16 + 4 + (long)local_58);
          }
        }
      }
    }
    if (local_84 == 0) {
      local_3b8 = local_8c;
    }
    else {
      local_3b8 = local_84;
    }
    *in_RDX = local_3b8;
    if (local_88 == 0) {
      local_3bc = local_8c;
    }
    else {
      local_3bc = local_88;
    }
    in_RDX[1] = local_3bc;
    local_328 = (long)in_R8 + (in_R9 - (long)local_60);
    break;
  case 5:
    lVar4 = *(long *)(in_RDI + 0x30);
    lVar5 = *(long *)(in_RDI + 8);
    uVar1 = *(uint *)(in_RDI + 0x18);
    pvVar14 = (void *)(lVar5 + (ulong)uVar1);
    pvVar15 = (void *)((long)in_R8 + in_R9 + -8);
    uVar2 = *in_RDX;
    uVar3 = in_RDX[1];
    local_154 = 0;
    local_120 = (void *)((long)in_R8 + (long)(int)(uint)(in_R8 == pvVar14));
    uVar10 = (int)local_120 - (int)pvVar14;
    local_150 = uVar3;
    if (uVar10 < uVar3) {
      local_150 = 0;
      local_154 = uVar3;
    }
    local_14c = uVar2;
    local_128 = in_R8;
    if (uVar10 < uVar2) {
      local_14c = 0;
      local_154 = uVar2;
    }
    while (local_120 < pvVar15) {
      sVar16 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                            in_stack_fffffffffffffb54,in_stack_fffffffffffffb50);
      iVar8 = (int)lVar5;
      iVar7 = (int)local_120;
      iVar11 = iVar7 - iVar8;
      uVar2 = *(uint *)(lVar4 + sVar16 * 4);
      local_178 = (void *)(lVar5 + (ulong)uVar2);
      *(int *)(lVar4 + sVar16 * 4) = iVar11;
      UVar12 = MEM_read32((void *)((long)local_120 + (1 - (ulong)local_14c)));
      UVar13 = MEM_read32((void *)((long)local_120 + 1));
      if (local_14c == 0 || UVar12 != UVar13) {
        if (uVar1 < uVar2) {
          UVar12 = MEM_read32(local_178);
          UVar13 = MEM_read32(local_120);
          if (UVar12 == UVar13) {
            sVar16 = ZSTD_count((BYTE *)in_stack_fffffffffffffb88,
                                (BYTE *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80
                                                ),(BYTE *)in_stack_fffffffffffffb78);
            local_160 = sVar16 + 4;
            iVar9 = (int)local_178;
            while( true ) {
              bVar18 = false;
              if (local_128 < local_120 && pvVar14 < local_178) {
                bVar18 = *(char *)((long)local_120 + -1) == *(char *)((long)local_178 + -1);
              }
              if (!bVar18) break;
              local_120 = (void *)((long)local_120 + -1);
              local_178 = (void *)((long)local_178 + -1);
              local_160 = local_160 + 1;
            }
            local_150 = local_14c;
            ZSTD_storeSeq(in_stack_fffffffffffffb60,
                          CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                          (void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                          in_stack_fffffffffffffb4c,0x2a668b);
            local_14c = iVar7 - iVar9;
            goto LAB_002a668b;
          }
        }
        local_120 = (void *)(((long)local_120 - (long)local_128 >> 8) + (ulong)uVar19 +
                            (long)local_120);
      }
      else {
        sVar16 = ZSTD_count((BYTE *)in_stack_fffffffffffffb88,
                            (BYTE *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            (BYTE *)in_stack_fffffffffffffb78);
        local_160 = sVar16 + 4;
        local_120 = (void *)((long)local_120 + 1);
        ZSTD_storeSeq(in_stack_fffffffffffffb60,
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                      (void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                      in_stack_fffffffffffffb4c,0x2a64bb);
LAB_002a668b:
        local_128 = (void *)(local_160 + (long)local_120);
        local_120 = local_128;
        if (local_128 <= pvVar15) {
          sVar16 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58
                                                ),in_stack_fffffffffffffb54,
                                in_stack_fffffffffffffb50);
          *(int *)(lVar4 + sVar16 * 4) = iVar11 + 2;
          sVar16 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58
                                                ),in_stack_fffffffffffffb54,
                                in_stack_fffffffffffffb50);
          *(int *)(lVar4 + sVar16 * 4) = ((int)local_128 + -2) - iVar8;
          while( true ) {
            uVar2 = local_150;
            bVar18 = false;
            if (local_120 <= pvVar15) {
              UVar12 = MEM_read32(local_120);
              UVar13 = MEM_read32((void *)((long)local_120 - (ulong)local_150));
              bVar18 = local_150 != 0 && UVar12 == UVar13;
            }
            local_128 = local_120;
            if (!bVar18) break;
            sVar16 = ZSTD_count((BYTE *)in_stack_fffffffffffffb88,
                                (BYTE *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80
                                                ),(BYTE *)in_stack_fffffffffffffb78);
            local_150 = local_14c;
            local_14c = uVar2;
            sVar17 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,
                                                   in_stack_fffffffffffffb58),
                                  in_stack_fffffffffffffb54,in_stack_fffffffffffffb50);
            *(int *)(lVar4 + sVar17 * 4) = (int)local_120 - iVar8;
            ZSTD_storeSeq(in_stack_fffffffffffffb60,
                          CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                          (void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                          in_stack_fffffffffffffb4c,0x2a6915);
            local_120 = (void *)(sVar16 + 4 + (long)local_120);
          }
        }
      }
    }
    if (local_14c == 0) {
      local_408 = local_154;
    }
    else {
      local_408 = local_14c;
    }
    *in_RDX = local_408;
    if (local_150 == 0) {
      local_40c = local_154;
    }
    else {
      local_40c = local_150;
    }
    in_RDX[1] = local_40c;
    local_328 = (long)in_R8 + (in_R9 - (long)local_128);
    break;
  case 6:
    lVar4 = *(long *)(in_RDI + 0x30);
    lVar5 = *(long *)(in_RDI + 8);
    uVar1 = *(uint *)(in_RDI + 0x18);
    pvVar14 = (void *)(lVar5 + (ulong)uVar1);
    pvVar15 = (void *)((long)in_R8 + in_R9 + -8);
    uVar2 = *in_RDX;
    uVar3 = in_RDX[1];
    local_21c = 0;
    local_1e8 = (void *)((long)in_R8 + (long)(int)(uint)(in_R8 == pvVar14));
    uVar10 = (int)local_1e8 - (int)pvVar14;
    local_218 = uVar3;
    if (uVar10 < uVar3) {
      local_218 = 0;
      local_21c = uVar3;
    }
    local_214 = uVar2;
    local_1f0 = in_R8;
    if (uVar10 < uVar2) {
      local_214 = 0;
      local_21c = uVar2;
    }
    while (local_1e8 < pvVar15) {
      sVar16 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                            in_stack_fffffffffffffb54,in_stack_fffffffffffffb50);
      iVar8 = (int)lVar5;
      iVar7 = (int)local_1e8;
      iVar11 = iVar7 - iVar8;
      uVar2 = *(uint *)(lVar4 + sVar16 * 4);
      local_240 = (void *)(lVar5 + (ulong)uVar2);
      *(int *)(lVar4 + sVar16 * 4) = iVar11;
      UVar12 = MEM_read32((void *)((long)local_1e8 + (1 - (ulong)local_214)));
      UVar13 = MEM_read32((void *)((long)local_1e8 + 1));
      if (local_214 == 0 || UVar12 != UVar13) {
        if (uVar1 < uVar2) {
          UVar12 = MEM_read32(local_240);
          UVar13 = MEM_read32(local_1e8);
          if (UVar12 == UVar13) {
            sVar16 = ZSTD_count((BYTE *)in_stack_fffffffffffffb88,
                                (BYTE *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80
                                                ),(BYTE *)in_stack_fffffffffffffb78);
            local_228 = sVar16 + 4;
            iVar9 = (int)local_240;
            while( true ) {
              bVar18 = false;
              if (local_1f0 < local_1e8 && pvVar14 < local_240) {
                bVar18 = *(char *)((long)local_1e8 + -1) == *(char *)((long)local_240 + -1);
              }
              if (!bVar18) break;
              local_1e8 = (void *)((long)local_1e8 + -1);
              local_240 = (void *)((long)local_240 + -1);
              local_228 = local_228 + 1;
            }
            local_218 = local_214;
            ZSTD_storeSeq(in_stack_fffffffffffffb60,
                          CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                          (void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                          in_stack_fffffffffffffb4c,0x2a6f49);
            local_214 = iVar7 - iVar9;
            goto LAB_002a6f49;
          }
        }
        local_1e8 = (void *)(((long)local_1e8 - (long)local_1f0 >> 8) + (ulong)uVar19 +
                            (long)local_1e8);
      }
      else {
        sVar16 = ZSTD_count((BYTE *)in_stack_fffffffffffffb88,
                            (BYTE *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            (BYTE *)in_stack_fffffffffffffb78);
        local_228 = sVar16 + 4;
        local_1e8 = (void *)((long)local_1e8 + 1);
        ZSTD_storeSeq(in_stack_fffffffffffffb60,
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                      (void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                      in_stack_fffffffffffffb4c,0x2a6d79);
LAB_002a6f49:
        local_1f0 = (void *)(local_228 + (long)local_1e8);
        local_1e8 = local_1f0;
        if (local_1f0 <= pvVar15) {
          sVar16 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58
                                                ),in_stack_fffffffffffffb54,
                                in_stack_fffffffffffffb50);
          *(int *)(lVar4 + sVar16 * 4) = iVar11 + 2;
          sVar16 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58
                                                ),in_stack_fffffffffffffb54,
                                in_stack_fffffffffffffb50);
          *(int *)(lVar4 + sVar16 * 4) = ((int)local_1f0 + -2) - iVar8;
          while( true ) {
            uVar2 = local_218;
            bVar18 = false;
            if (local_1e8 <= pvVar15) {
              UVar12 = MEM_read32(local_1e8);
              UVar13 = MEM_read32((void *)((long)local_1e8 - (ulong)local_218));
              bVar18 = local_218 != 0 && UVar12 == UVar13;
            }
            local_1f0 = local_1e8;
            if (!bVar18) break;
            sVar16 = ZSTD_count((BYTE *)in_stack_fffffffffffffb88,
                                (BYTE *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80
                                                ),(BYTE *)in_stack_fffffffffffffb78);
            local_218 = local_214;
            local_214 = uVar2;
            sVar17 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,
                                                   in_stack_fffffffffffffb58),
                                  in_stack_fffffffffffffb54,in_stack_fffffffffffffb50);
            *(int *)(lVar4 + sVar17 * 4) = (int)local_1e8 - iVar8;
            ZSTD_storeSeq(in_stack_fffffffffffffb60,
                          CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                          (void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                          in_stack_fffffffffffffb4c,0x2a71ac);
            local_1e8 = (void *)(sVar16 + 4 + (long)local_1e8);
          }
        }
      }
    }
    if (local_214 == 0) {
      local_458 = local_21c;
    }
    else {
      local_458 = local_214;
    }
    *in_RDX = local_458;
    if (local_218 == 0) {
      local_45c = local_21c;
    }
    else {
      local_45c = local_218;
    }
    in_RDX[1] = local_45c;
    local_328 = (long)in_R8 + (in_R9 - (long)local_1f0);
    break;
  case 7:
    psVar6 = *(seqStore_t **)(in_RDI + 0x30);
    lVar4 = *(long *)(in_RDI + 8);
    uVar1 = *(uint *)(in_RDI + 0x18);
    pvVar14 = (void *)(lVar4 + (ulong)uVar1);
    pvVar15 = (void *)((long)in_R8 + in_R9 + -8);
    uVar2 = *in_RDX;
    uVar3 = in_RDX[1];
    local_2e4 = 0;
    local_2b0 = (void *)((long)in_R8 + (long)(int)(uint)(in_R8 == pvVar14));
    uVar10 = (int)local_2b0 - (int)pvVar14;
    local_2e0 = uVar3;
    if (uVar10 < uVar3) {
      local_2e0 = 0;
      local_2e4 = uVar3;
    }
    local_2dc = uVar2;
    local_2b8 = in_R8;
    if (uVar10 < uVar2) {
      local_2dc = 0;
      local_2e4 = uVar2;
    }
    while (local_2b0 < pvVar15) {
      sVar16 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                            in_stack_fffffffffffffb54,in_stack_fffffffffffffb50);
      iVar8 = (int)lVar4;
      iVar7 = (int)local_2b0;
      iVar11 = iVar7 - iVar8;
      uVar2 = *(uint *)((long)&psVar6->sequencesStart + sVar16 * 4);
      local_308 = (void *)(lVar4 + (ulong)uVar2);
      *(int *)((long)&psVar6->sequencesStart + sVar16 * 4) = iVar11;
      UVar12 = MEM_read32((void *)((long)local_2b0 + (1 - (ulong)local_2dc)));
      UVar13 = MEM_read32((void *)((long)local_2b0 + 1));
      if (local_2dc == 0 || UVar12 != UVar13) {
        if (uVar1 < uVar2) {
          UVar12 = MEM_read32(local_308);
          UVar13 = MEM_read32(local_2b0);
          if (UVar12 == UVar13) {
            sVar16 = ZSTD_count((BYTE *)in_stack_fffffffffffffb88,
                                (BYTE *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80
                                                ),(BYTE *)in_stack_fffffffffffffb78);
            local_2f0 = sVar16 + 4;
            iVar9 = (int)local_308;
            while( true ) {
              bVar18 = false;
              if (local_2b8 < local_2b0 && pvVar14 < local_308) {
                bVar18 = *(char *)((long)local_2b0 + -1) == *(char *)((long)local_308 + -1);
              }
              if (!bVar18) break;
              local_2b0 = (void *)((long)local_2b0 + -1);
              local_308 = (void *)((long)local_308 + -1);
              local_2f0 = local_2f0 + 1;
            }
            local_2e0 = local_2dc;
            ZSTD_storeSeq(in_stack_fffffffffffffb60,
                          CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                          (void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                          in_stack_fffffffffffffb4c,0x2a77b3);
            local_2dc = iVar7 - iVar9;
            goto LAB_002a77b3;
          }
        }
        local_2b0 = (void *)(((long)local_2b0 - (long)local_2b8 >> 8) + (ulong)uVar19 +
                            (long)local_2b0);
      }
      else {
        sVar16 = ZSTD_count((BYTE *)in_stack_fffffffffffffb88,
                            (BYTE *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            (BYTE *)in_stack_fffffffffffffb78);
        local_2f0 = sVar16 + 4;
        local_2b0 = (void *)((long)local_2b0 + 1);
        ZSTD_storeSeq(in_stack_fffffffffffffb60,
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                      (void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                      in_stack_fffffffffffffb4c,0x2a75f2);
LAB_002a77b3:
        local_2b8 = (void *)(local_2f0 + (long)local_2b0);
        local_2b0 = local_2b8;
        if (local_2b8 <= pvVar15) {
          in_stack_fffffffffffffb78 = psVar6;
          sVar16 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58
                                                ),in_stack_fffffffffffffb54,
                                in_stack_fffffffffffffb50);
          *(int *)((long)&in_stack_fffffffffffffb78->sequencesStart + sVar16 * 4) = iVar11 + 2;
          in_stack_fffffffffffffb84 = ((int)local_2b8 + -2) - iVar8;
          in_stack_fffffffffffffb88 = psVar6;
          sVar16 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58
                                                ),in_stack_fffffffffffffb54,
                                in_stack_fffffffffffffb50);
          *(int *)((long)&in_stack_fffffffffffffb88->sequencesStart + sVar16 * 4) =
               in_stack_fffffffffffffb84;
          while( true ) {
            uVar2 = local_2e0;
            bVar18 = false;
            if (local_2b0 <= pvVar15) {
              UVar12 = MEM_read32(local_2b0);
              UVar13 = MEM_read32((void *)((long)local_2b0 - (ulong)local_2e0));
              bVar18 = local_2e0 != 0 && UVar12 == UVar13;
            }
            local_2b8 = local_2b0;
            if (!bVar18) break;
            sVar16 = ZSTD_count((BYTE *)in_stack_fffffffffffffb88,
                                (BYTE *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80
                                                ),(BYTE *)in_stack_fffffffffffffb78);
            local_2e0 = local_2dc;
            local_2dc = uVar2;
            in_stack_fffffffffffffb5c = (int)local_2b0 - iVar8;
            in_stack_fffffffffffffb60 = psVar6;
            sVar17 = ZSTD_hashPtr((void *)CONCAT44(in_stack_fffffffffffffb5c,
                                                   in_stack_fffffffffffffb58),
                                  in_stack_fffffffffffffb54,in_stack_fffffffffffffb50);
            *(int *)((long)&in_stack_fffffffffffffb60->sequencesStart + sVar17 * 4) =
                 in_stack_fffffffffffffb5c;
            ZSTD_storeSeq(in_stack_fffffffffffffb60,
                          CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                          (void *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                          in_stack_fffffffffffffb4c,0x2a7a04);
            local_2b0 = (void *)(sVar16 + 4 + (long)local_2b0);
          }
        }
      }
    }
    uVar19 = local_2e4;
    if (local_2dc != 0) {
      uVar19 = local_2dc;
    }
    *in_RDX = uVar19;
    if (local_2e0 != 0) {
      local_2e4 = local_2e0;
    }
    in_RDX[1] = local_2e4;
    local_328 = (long)in_R8 + (in_R9 - (long)local_2b8);
  }
  return local_328;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    U32 const hlog = cParams->hashLog;
    U32 const mls = cParams->searchLength;
    U32 const stepSize = cParams->targetLength;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, hlog, stepSize, 7);
    }
}